

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stop.c
# Opt level: O3

wheelchair_boarding_t parse_wheelchair_boarding(char *value)

{
  byte bVar1;
  
  bVar1 = *value;
  if (bVar1 < 0x31) {
    if (bVar1 == 0) {
      return (uint)bVar1;
    }
    if (bVar1 == 0x30) {
      return (uint)(value[1] != '\0') * 3;
    }
  }
  else {
    if (bVar1 == 0x31) {
      return (uint)(value[1] != '\0') * 2 + WB_SOME;
    }
    if (bVar1 == 0x32) {
      return WB_NOT_SET - (value[1] == '\0');
    }
  }
  return WB_NOT_SET;
}

Assistant:

wheelchair_boarding_t parse_wheelchair_boarding(const char *value) {
    if (strcmp(value, "0") == 0 || strcmp(value, "") == 0)
        return WB_UNKNOWN_OR_INHERITED;
    else if (strcmp(value, "1") == 0)
        return WB_SOME;
    else if (strcmp(value, "2") == 0)
        return WB_NOT_POSSIBLE;
    else
        return WB_NOT_SET;
}